

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_get_message(Curl_easy *data,bufref *out)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  size_t len;
  char *ptr;
  
  pcVar2 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
  uVar1 = (data->conn->proto).ftpc.pp.nfinal;
  if (uVar1 < 3) {
    ptr = "";
    len = 0;
  }
  else {
    lVar3 = 2 - uVar1;
    for (ptr = pcVar2 + 2; (*ptr == '\t' || (*ptr == ' ')); ptr = ptr + 1) {
      lVar3 = lVar3 + 1;
    }
    lVar4 = 0;
    while (((lVar3 != lVar4 && ((ulong)(byte)pcVar2[lVar4 + (uVar1 - 1)] < 0x21)) &&
           ((0x100002600U >> ((ulong)(byte)pcVar2[lVar4 + (uVar1 - 1)] & 0x3f) & 1) != 0))) {
      lVar4 = lVar4 + -1;
    }
    pcVar2[lVar4 + uVar1] = '\0';
    len = lVar4 - lVar3;
  }
  Curl_bufref_set(out,ptr,len,(_func_void_void_ptr *)0x0);
  return CURLE_OK;
}

Assistant:

static CURLcode pop3_get_message(struct Curl_easy *data, struct bufref *out)
{
  char *message = Curl_dyn_ptr(&data->conn->proto.pop3c.pp.recvbuf);
  size_t len = data->conn->proto.pop3c.pp.nfinal;

  if(len > 2) {
    /* Find the start of the message */
    len -= 2;
    for(message += 2; *message == ' ' || *message == '\t'; message++, len--)
      ;

    /* Find the end of the message */
    while(len--)
      if(message[len] != '\r' && message[len] != '\n' && message[len] != ' ' &&
         message[len] != '\t')
        break;

    /* Terminate the message */
    message[++len] = '\0';
    Curl_bufref_set(out, message, len, NULL);
  }
  else
    /* junk input => zero length output */
    Curl_bufref_set(out, "", 0, NULL);

  return CURLE_OK;
}